

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpxpes_parser.cc
# Opt level: O1

bool __thiscall libwebm::VpxPesParser::ParsePesHeader(VpxPesParser *this,PesHeader *header)

{
  VpxPesParser VVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  
  if ((header != (PesHeader *)0x0) && (*(int *)(this + 0x78) == 1)) {
    lVar3 = *(long *)(this + 0x70);
    lVar4 = *(long *)(this + 0x58);
    if ((lVar3 + 2U <= (ulong)(*(long *)(this + 0x60) - lVar4)) &&
       (((*(char *)(lVar4 + lVar3) == '\0' && (*(char *)(lVar4 + 1 + lVar3) == '\0')) &&
        (*(char *)(lVar4 + lVar3 + 2U) == '\x01')))) {
      lVar4 = 0;
      do {
        header->start_code[lVar4] = *(uint8_t *)(lVar4 + *(long *)(this + 0x58) + lVar3);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      if (3 < (*(int *)(this + 0x60) - (int)*(long *)(this + 0x70)) - (int)*(long *)(this + 0x58)) {
        VVar1 = *(VpxPesParser *)(*(long *)(this + 0x58) + 3 + *(long *)(this + 0x70));
        header->stream_id = (uint8_t)VVar1;
        if (((byte)*this <= (byte)VVar1) && ((byte)VVar1 <= (byte)this[1])) {
          lVar3 = *(long *)(this + 0x70);
          if (5 < (*(int *)(this + 0x60) - (int)lVar3) - (int)*(long *)(this + 0x58)) {
            uVar2 = *(ushort *)(*(long *)(this + 0x58) + 4 + lVar3);
            header->packet_length = uVar2 << 8 | uVar2 >> 8;
            *(long *)(this + 0x70) = lVar3 + *(long *)(this + 8);
            *(undefined4 *)(this + 0x78) = 2;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool VpxPesParser::ParsePesHeader(PesHeader* header) {
  if (!header || parse_state_ != kParsePesHeader)
    return false;

  if (!VerifyPacketStartCode())
    return false;

  std::size_t pos = read_pos_;
  for (auto& a : header->start_code) {
    a = pes_file_data_[pos++];
  }

  // PES Video stream IDs start at E0.
  if (!ReadStreamId(&header->stream_id))
    return false;

  if (header->stream_id < kMinVideoStreamId ||
      header->stream_id > kMaxVideoStreamId)
    return false;

  if (!ReadPacketLength(&header->packet_length))
    return false;

  read_pos_ += kPesHeaderSize;
  parse_state_ = kParsePesOptionalHeader;
  return true;
}